

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_widget_at.cpp
# Opt level: O0

Widget * cppurses::detail::find_widget_at(size_t x,size_t y)

{
  bool bVar1;
  bool bVar2;
  vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
  *pvVar3;
  reference this;
  type w;
  pointer this_00;
  byte local_51;
  unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_> *child;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
  *__range3;
  Widget *pWStack_28;
  bool keep_going;
  Widget *widg;
  size_t y_local;
  size_t x_local;
  
  pWStack_28 = System::head();
  if ((pWStack_28 == (Widget *)0x0) ||
     (bVar1 = anon_unknown.dwarf_191323::has_coordinates(pWStack_28,x,y), !bVar1)) {
    x_local = 0;
  }
  else {
    bVar1 = true;
LAB_00240c56:
    local_51 = 0;
    if (bVar1) {
      pvVar3 = Children_data::get(&pWStack_28->children);
      bVar2 = std::
              vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
              ::empty(pvVar3);
      local_51 = bVar2 ^ 0xff;
    }
    if ((local_51 & 1) != 0) {
      pvVar3 = Children_data::get(&pWStack_28->children);
      __end3 = std::
               vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
               ::begin(pvVar3);
      child = (unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_> *)
              std::
              vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
              ::end(pvVar3);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_*,_std::vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>_>
                                         *)&child), bVar2) {
        this = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_*,_std::vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>_>
               ::operator*(&__end3);
        w = std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>::operator*
                      (this);
        bVar1 = anon_unknown.dwarf_191323::has_coordinates(w,x,y);
        if (bVar1) {
          this_00 = std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>::
                    operator->(this);
          bVar1 = Widget::enabled(this_00);
          if (bVar1) {
            pWStack_28 = std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>::
                         get(this);
            bVar1 = true;
            break;
          }
        }
        bVar1 = false;
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_*,_std::vector<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>_>
        ::operator++(&__end3);
      }
      goto LAB_00240c56;
    }
    x_local = (size_t)pWStack_28;
  }
  return (Widget *)x_local;
}

Assistant:

Widget* find_widget_at(std::size_t x, std::size_t y) {
    Widget* widg = System::head();
    if (widg == nullptr || !has_coordinates(*widg, x, y)) {
        return nullptr;
    }
    bool keep_going = true;
    while (keep_going && !widg->children.get().empty()) {
        for (const auto& child : widg->children.get()) {
            if (has_coordinates(*child, x, y) && child->enabled()) {
                widg = child.get();
                keep_going = true;
                break;
            }
            keep_going = false;
        }
    }
    return widg;
}